

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O1

UModelIndex * __thiscall
TreeModel::findParentOfType
          (UModelIndex *__return_storage_ptr__,TreeModel *this,UModelIndex *index,UINT8 type)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  UModelIndex parent;
  UModelIndex local_68;
  UModelIndex local_48;
  
  if (((-1 < index->r) && (-1 < index->c)) && (index->m != (TreeModel *)0x0)) {
    if (index->m == (TreeModel *)0x0) {
      local_68.r = -1;
      local_68.c = -1;
      local_68.i = 0;
      local_68.m = (TreeModel *)0x0;
    }
    else {
      TreeModel::parent(&local_68,index->m,index);
    }
    if (((-1 < local_68.r) && (-1 < (long)local_68._0_8_)) && (local_68.m != (TreeModel *)0x0)) {
      if (index->m == (TreeModel *)0x0) {
        local_68.r = -1;
        local_68.c = -1;
        local_68.i = 0;
        local_68.m = (TreeModel *)0x0;
      }
      else {
        TreeModel::parent(&local_68,index->m,index);
      }
      bVar3 = this->rootItem == (TreeItem *)local_68.i;
      bVar1 = bVar3 || (TreeItem *)local_68.i == (TreeItem *)0x0;
      if (!bVar3 && (TreeItem *)local_68.i != (TreeItem *)0x0) {
        if (*(UINT8 *)(local_68.i + 0x1d) != type) {
          lVar2 = local_68._0_8_;
          do {
            local_68._0_8_ = lVar2;
            if (local_68.m == (TreeModel *)0x0) {
              local_48.r = -1;
              local_48.c = -1;
              local_48.i = 0;
              local_48.m = (TreeModel *)0x0;
            }
            else {
              TreeModel::parent(&local_48,local_68.m,&local_68);
            }
            local_68.m = local_48.m;
            lVar2._0_4_ = local_48.r;
            lVar2._4_4_ = local_48.c;
            local_68.r = local_48.r;
            local_68.c = local_48.c;
            local_68.i = local_48.i;
            bVar1 = this->rootItem == (TreeItem *)local_48.i ||
                    (TreeItem *)local_48.i == (TreeItem *)0x0;
            if (bVar1) goto LAB_0012db9a;
          } while (*(UINT8 *)(local_48.i + 0x1d) != type);
        }
        if (!bVar1) {
          __return_storage_ptr__->m = local_68.m;
          __return_storage_ptr__->r = local_68.r;
          __return_storage_ptr__->c = local_68.c;
          __return_storage_ptr__->i = local_68.i;
          return __return_storage_ptr__;
        }
      }
    }
  }
LAB_0012db9a:
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  __return_storage_ptr__->m = (TreeModel *)0x0;
  return __return_storage_ptr__;
}

Assistant:

UModelIndex TreeModel::findParentOfType(const UModelIndex& index, UINT8 type) const
{
    if (!index.isValid() || !index.parent().isValid())
        return UModelIndex();
    
    TreeItem *item;
    UModelIndex parent = index.parent();
    
    for (item = static_cast<TreeItem*>(parent.internalPointer());
         item != NULL && item != rootItem && item->type() != type;
         item = static_cast<TreeItem*>(parent.internalPointer()))
        parent = parent.parent();
    if (item != NULL && item != rootItem)
        return parent;
    
    return UModelIndex();
}